

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall ON_3dPoint::operator>=(ON_3dPoint *this,ON_3dPoint *p)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  
  dVar1 = this->x;
  dVar2 = p->x;
  bVar3 = 1;
  if (dVar1 <= dVar2) {
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      bVar3 = 0;
    }
    else if (this->y <= p->y) {
      bVar3 = -(p->z <= this->z) & -(this->y == p->y);
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool ON_3dPoint::operator>=( const ON_3dPoint& p ) const
{
  // dictionary order
  return ((x>p.x)?true:((x==p.x)?((y>p.y)?true:(y==p.y&&z>=p.z)?true:false):false));
}